

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16781328,_true,_embree::sse42::VirtualCurveIntersectorK<4>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  uint uVar12;
  int iVar13;
  size_t sVar14;
  undefined8 uVar15;
  long lVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar21;
  int iVar22;
  AABBNodeMB4D *node1;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  undefined4 uVar26;
  ulong unaff_RBP;
  undefined4 uVar27;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar28;
  size_t sVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  float fVar44;
  float fVar45;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar46;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  vint4 bi;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar55;
  float fVar56;
  float fVar57;
  float fVar66;
  float fVar68;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar67;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar65;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar84;
  float fVar85;
  undefined1 auVar79 [16];
  float fVar86;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar83;
  float fVar87;
  float fVar90;
  float fVar91;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar92;
  float fVar93;
  vint4 ai;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  vint4 bi_1;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  vint4 ai_3;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  vint4 ai_1;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float local_10f8;
  float fStack_10f4;
  float fStack_10f0;
  float fStack_10ec;
  vfloat<4> tNear;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar28 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar5 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar6 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar7 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar8 = *(float *)((long)&(tray->dir).field_0 + k * 4);
  fVar9 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x10);
  fVar10 = *(float *)((long)&(tray->dir).field_0 + k * 4 + 0x20);
  fVar97 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar102 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar107 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar113 = fVar97 * 0.99999964;
  fVar87 = fVar102 * 0.99999964;
  fVar112 = fVar107 * 0.99999964;
  fVar97 = fVar97 * 1.0000004;
  fVar102 = fVar102 * 1.0000004;
  fVar107 = fVar107 * 1.0000004;
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar47 = (tray->tnear).field_0.i[k];
  auVar94._4_4_ = iVar47;
  auVar94._0_4_ = iVar47;
  auVar94._8_4_ = iVar47;
  auVar94._12_4_ = iVar47;
  iVar47 = (tray->tfar).field_0.i[k];
  iVar48 = iVar47;
  iVar49 = iVar47;
  iVar50 = iVar47;
  while (pSVar28 != stack) {
    pSVar21 = pSVar28 + -1;
    pSVar28 = pSVar28 + -1;
    if ((float)pSVar21->dist < *(float *)(ray + k * 4 + 0x80) ||
        (float)pSVar21->dist == *(float *)(ray + k * 4 + 0x80)) {
      sVar29 = (pSVar28->ptr).ptr;
      do {
        if ((sVar29 & 8) == 0) {
          fVar11 = *(float *)(ray + k * 4 + 0x70);
          uVar24 = (uint)sVar29 & 7;
          uVar23 = sVar29 & 0xfffffffffffffff0;
          uVar27 = (undefined4)(unaff_RBP >> 0x20);
          if (uVar24 == 3) {
            fVar92 = 1.0 - fVar11;
            fVar93 = fVar92 * 0.0;
            auVar95._0_4_ =
                 fVar8 * *(float *)(uVar23 + 0x20) +
                 fVar9 * *(float *)(uVar23 + 0x50) + fVar10 * *(float *)(uVar23 + 0x80);
            auVar95._4_4_ =
                 fVar8 * *(float *)(uVar23 + 0x24) +
                 fVar9 * *(float *)(uVar23 + 0x54) + fVar10 * *(float *)(uVar23 + 0x84);
            auVar95._8_4_ =
                 fVar8 * *(float *)(uVar23 + 0x28) +
                 fVar9 * *(float *)(uVar23 + 0x58) + fVar10 * *(float *)(uVar23 + 0x88);
            auVar95._12_4_ =
                 fVar8 * *(float *)(uVar23 + 0x2c) +
                 fVar9 * *(float *)(uVar23 + 0x5c) + fVar10 * *(float *)(uVar23 + 0x8c);
            fVar98 = (float)DAT_01ff1d40;
            fVar99 = DAT_01ff1d40._4_4_;
            fVar100 = DAT_01ff1d40._8_4_;
            fVar101 = DAT_01ff1d40._12_4_;
            auVar73._4_4_ = -(uint)(ABS(auVar95._4_4_) < fVar99);
            auVar73._0_4_ = -(uint)(ABS(auVar95._0_4_) < fVar98);
            auVar73._8_4_ = -(uint)(ABS(auVar95._8_4_) < fVar100);
            auVar73._12_4_ = -(uint)(ABS(auVar95._12_4_) < fVar101);
            auVar89 = blendvps(auVar95,_DAT_01ff1d40,auVar73);
            local_10f8 = (float)*(undefined8 *)(uVar23 + 0x30);
            fStack_10f4 = (float)((ulong)*(undefined8 *)(uVar23 + 0x30) >> 0x20);
            fStack_10f0 = (float)*(undefined8 *)(uVar23 + 0x38);
            fStack_10ec = (float)((ulong)*(undefined8 *)(uVar23 + 0x38) >> 0x20);
            auVar75._0_4_ =
                 fVar8 * local_10f8 +
                 fVar9 * *(float *)(uVar23 + 0x60) + fVar10 * *(float *)(uVar23 + 0x90);
            auVar75._4_4_ =
                 fVar8 * fStack_10f4 +
                 fVar9 * *(float *)(uVar23 + 100) + fVar10 * *(float *)(uVar23 + 0x94);
            auVar75._8_4_ =
                 fVar8 * fStack_10f0 +
                 fVar9 * *(float *)(uVar23 + 0x68) + fVar10 * *(float *)(uVar23 + 0x98);
            auVar75._12_4_ =
                 fVar8 * fStack_10ec +
                 fVar9 * *(float *)(uVar23 + 0x6c) + fVar10 * *(float *)(uVar23 + 0x9c);
            auVar81._4_4_ = -(uint)(ABS(auVar75._4_4_) < fVar99);
            auVar81._0_4_ = -(uint)(ABS(auVar75._0_4_) < fVar98);
            auVar81._8_4_ = -(uint)(ABS(auVar75._8_4_) < fVar100);
            auVar81._12_4_ = -(uint)(ABS(auVar75._12_4_) < fVar101);
            auVar81 = blendvps(auVar75,_DAT_01ff1d40,auVar81);
            local_1078 = (float)*(undefined8 *)(uVar23 + 0xa0);
            fStack_1074 = (float)((ulong)*(undefined8 *)(uVar23 + 0xa0) >> 0x20);
            fStack_1070 = (float)*(undefined8 *)(uVar23 + 0xa8);
            fStack_106c = (float)((ulong)*(undefined8 *)(uVar23 + 0xa8) >> 0x20);
            auVar61._0_4_ =
                 fVar8 * *(float *)(uVar23 + 0x40) +
                 fVar9 * *(float *)(uVar23 + 0x70) + fVar10 * local_1078;
            auVar61._4_4_ =
                 fVar8 * *(float *)(uVar23 + 0x44) +
                 fVar9 * *(float *)(uVar23 + 0x74) + fVar10 * fStack_1074;
            auVar61._8_4_ =
                 fVar8 * *(float *)(uVar23 + 0x48) +
                 fVar9 * *(float *)(uVar23 + 0x78) + fVar10 * fStack_1070;
            auVar61._12_4_ =
                 fVar8 * *(float *)(uVar23 + 0x4c) +
                 fVar9 * *(float *)(uVar23 + 0x7c) + fVar10 * fStack_106c;
            auVar82._4_4_ = -(uint)(ABS(auVar61._4_4_) < fVar99);
            auVar82._0_4_ = -(uint)(ABS(auVar61._0_4_) < fVar98);
            auVar82._8_4_ = -(uint)(ABS(auVar61._8_4_) < fVar100);
            auVar82._12_4_ = -(uint)(ABS(auVar61._12_4_) < fVar101);
            auVar73 = blendvps(auVar61,_DAT_01ff1d40,auVar82);
            auVar34 = rcpps(auVar82,auVar89);
            fVar98 = auVar34._0_4_;
            fVar101 = auVar34._4_4_;
            fVar90 = auVar34._8_4_;
            fVar91 = auVar34._12_4_;
            fVar98 = (1.0 - auVar89._0_4_ * fVar98) * fVar98 + fVar98;
            fVar101 = (1.0 - auVar89._4_4_ * fVar101) * fVar101 + fVar101;
            fVar90 = (1.0 - auVar89._8_4_ * fVar90) * fVar90 + fVar90;
            fVar91 = (1.0 - auVar89._12_4_ * fVar91) * fVar91 + fVar91;
            auVar34 = rcpps(auVar34,auVar81);
            fVar99 = auVar34._0_4_;
            auVar76._0_4_ = auVar81._0_4_ * fVar99;
            fVar84 = auVar34._4_4_;
            auVar76._4_4_ = auVar81._4_4_ * fVar84;
            fVar85 = auVar34._8_4_;
            auVar76._8_4_ = auVar81._8_4_ * fVar85;
            fVar86 = auVar34._12_4_;
            auVar76._12_4_ = auVar81._12_4_ * fVar86;
            fVar99 = (1.0 - auVar76._0_4_) * fVar99 + fVar99;
            fVar84 = (1.0 - auVar76._4_4_) * fVar84 + fVar84;
            fVar85 = (1.0 - auVar76._8_4_) * fVar85 + fVar85;
            fVar86 = (1.0 - auVar76._12_4_) * fVar86 + fVar86;
            auVar34 = rcpps(auVar76,auVar73);
            fVar100 = auVar34._0_4_;
            fVar44 = auVar34._4_4_;
            fVar45 = auVar34._8_4_;
            fVar46 = auVar34._12_4_;
            fVar100 = (1.0 - auVar73._0_4_ * fVar100) * fVar100 + fVar100;
            fVar44 = (1.0 - auVar73._4_4_ * fVar44) * fVar44 + fVar44;
            fVar45 = (1.0 - auVar73._8_4_ * fVar45) * fVar45 + fVar45;
            fVar46 = (1.0 - auVar73._12_4_ * fVar46) * fVar46 + fVar46;
            fVar56 = *(float *)(uVar23 + 0x20) * fVar5 +
                     *(float *)(uVar23 + 0x50) * fVar6 +
                     *(float *)(uVar23 + 0x80) * fVar7 + *(float *)(uVar23 + 0xb0);
            fVar66 = *(float *)(uVar23 + 0x24) * fVar5 +
                     *(float *)(uVar23 + 0x54) * fVar6 +
                     *(float *)(uVar23 + 0x84) * fVar7 + *(float *)(uVar23 + 0xb4);
            fVar68 = *(float *)(uVar23 + 0x28) * fVar5 +
                     *(float *)(uVar23 + 0x58) * fVar6 +
                     *(float *)(uVar23 + 0x88) * fVar7 + *(float *)(uVar23 + 0xb8);
            fVar70 = *(float *)(uVar23 + 0x2c) * fVar5 +
                     *(float *)(uVar23 + 0x5c) * fVar6 +
                     *(float *)(uVar23 + 0x8c) * fVar7 + *(float *)(uVar23 + 0xbc);
            fVar57 = local_10f8 * fVar5 +
                     *(float *)(uVar23 + 0x60) * fVar6 +
                     *(float *)(uVar23 + 0x90) * fVar7 + *(float *)(uVar23 + 0xc0);
            fVar67 = fStack_10f4 * fVar5 +
                     *(float *)(uVar23 + 100) * fVar6 +
                     *(float *)(uVar23 + 0x94) * fVar7 + *(float *)(uVar23 + 0xc4);
            fVar69 = fStack_10f0 * fVar5 +
                     *(float *)(uVar23 + 0x68) * fVar6 +
                     *(float *)(uVar23 + 0x98) * fVar7 + *(float *)(uVar23 + 200);
            fVar71 = fStack_10ec * fVar5 +
                     *(float *)(uVar23 + 0x6c) * fVar6 +
                     *(float *)(uVar23 + 0x9c) * fVar7 + *(float *)(uVar23 + 0xcc);
            fVar114 = *(float *)(uVar23 + 0x40) * fVar5 +
                      *(float *)(uVar23 + 0x70) * fVar6 +
                      local_1078 * fVar7 + *(float *)(uVar23 + 0xd0);
            fVar115 = *(float *)(uVar23 + 0x44) * fVar5 +
                      *(float *)(uVar23 + 0x74) * fVar6 +
                      fStack_1074 * fVar7 + *(float *)(uVar23 + 0xd4);
            fVar116 = *(float *)(uVar23 + 0x48) * fVar5 +
                      *(float *)(uVar23 + 0x78) * fVar6 +
                      fStack_1070 * fVar7 + *(float *)(uVar23 + 0xd8);
            fVar117 = *(float *)(uVar23 + 0x4c) * fVar5 +
                      *(float *)(uVar23 + 0x7c) * fVar6 +
                      fStack_106c * fVar7 + *(float *)(uVar23 + 0xdc);
            fVar108 = ((*(float *)(uVar23 + 0xe0) * fVar11 + fVar93) - fVar56) * fVar98;
            fVar109 = ((*(float *)(uVar23 + 0xe4) * fVar11 + fVar93) - fVar66) * fVar101;
            fVar110 = ((*(float *)(uVar23 + 0xe8) * fVar11 + fVar93) - fVar68) * fVar90;
            fVar111 = ((*(float *)(uVar23 + 0xec) * fVar11 + fVar93) - fVar70) * fVar91;
            fVar98 = ((*(float *)(uVar23 + 0x110) * fVar11 + fVar92) - fVar56) * fVar98;
            fVar101 = ((*(float *)(uVar23 + 0x114) * fVar11 + fVar92) - fVar66) * fVar101;
            fVar90 = ((*(float *)(uVar23 + 0x118) * fVar11 + fVar92) - fVar68) * fVar90;
            fVar91 = ((*(float *)(uVar23 + 0x11c) * fVar11 + fVar92) - fVar70) * fVar91;
            fVar103 = ((*(float *)(uVar23 + 0xf0) * fVar11 + fVar93) - fVar57) * fVar99;
            fVar104 = ((*(float *)(uVar23 + 0xf4) * fVar11 + fVar93) - fVar67) * fVar84;
            fVar105 = ((*(float *)(uVar23 + 0xf8) * fVar11 + fVar93) - fVar69) * fVar85;
            fVar106 = ((*(float *)(uVar23 + 0xfc) * fVar11 + fVar93) - fVar71) * fVar86;
            fVar56 = ((fVar93 + *(float *)(uVar23 + 0x100) * fVar11) - fVar114) * fVar100;
            fVar66 = ((fVar93 + *(float *)(uVar23 + 0x104) * fVar11) - fVar115) * fVar44;
            fVar68 = ((fVar93 + *(float *)(uVar23 + 0x108) * fVar11) - fVar116) * fVar45;
            fVar70 = ((fVar93 + *(float *)(uVar23 + 0x10c) * fVar11) - fVar117) * fVar46;
            fVar99 = ((*(float *)(uVar23 + 0x120) * fVar11 + fVar92) - fVar57) * fVar99;
            fVar84 = ((*(float *)(uVar23 + 0x124) * fVar11 + fVar92) - fVar67) * fVar84;
            fVar85 = ((*(float *)(uVar23 + 0x128) * fVar11 + fVar92) - fVar69) * fVar85;
            fVar86 = ((*(float *)(uVar23 + 300) * fVar11 + fVar92) - fVar71) * fVar86;
            fVar100 = ((fVar11 * *(float *)(uVar23 + 0x130) + fVar92) - fVar114) * fVar100;
            fVar44 = ((fVar11 * *(float *)(uVar23 + 0x134) + fVar92) - fVar115) * fVar44;
            fVar45 = ((fVar11 * *(float *)(uVar23 + 0x138) + fVar92) - fVar116) * fVar45;
            fVar46 = ((fVar11 * *(float *)(uVar23 + 0x13c) + fVar92) - fVar117) * fVar46;
            auVar89._0_4_ =
                 (uint)((int)fVar99 < (int)fVar103) * (int)fVar99 |
                 (uint)((int)fVar99 >= (int)fVar103) * (int)fVar103;
            auVar89._4_4_ =
                 (uint)((int)fVar84 < (int)fVar104) * (int)fVar84 |
                 (uint)((int)fVar84 >= (int)fVar104) * (int)fVar104;
            auVar89._8_4_ =
                 (uint)((int)fVar85 < (int)fVar105) * (int)fVar85 |
                 (uint)((int)fVar85 >= (int)fVar105) * (int)fVar105;
            auVar89._12_4_ =
                 (uint)((int)fVar86 < (int)fVar106) * (int)fVar86 |
                 (uint)((int)fVar86 >= (int)fVar106) * (int)fVar106;
            auVar62._0_4_ =
                 (uint)((int)fVar100 < (int)fVar56) * (int)fVar100 |
                 (uint)((int)fVar100 >= (int)fVar56) * (int)fVar56;
            auVar62._4_4_ =
                 (uint)((int)fVar44 < (int)fVar66) * (int)fVar44 |
                 (uint)((int)fVar44 >= (int)fVar66) * (int)fVar66;
            auVar62._8_4_ =
                 (uint)((int)fVar45 < (int)fVar68) * (int)fVar45 |
                 (uint)((int)fVar45 >= (int)fVar68) * (int)fVar68;
            auVar62._12_4_ =
                 (uint)((int)fVar46 < (int)fVar70) * (int)fVar46 |
                 (uint)((int)fVar46 >= (int)fVar70) * (int)fVar70;
            auVar34 = maxps(auVar89,auVar62);
            auVar63._0_4_ =
                 (uint)((int)fVar98 < (int)fVar108) * (int)fVar98 |
                 (uint)((int)fVar98 >= (int)fVar108) * (int)fVar108;
            auVar63._4_4_ =
                 (uint)((int)fVar101 < (int)fVar109) * (int)fVar101 |
                 (uint)((int)fVar101 >= (int)fVar109) * (int)fVar109;
            auVar63._8_4_ =
                 (uint)((int)fVar90 < (int)fVar110) * (int)fVar90 |
                 (uint)((int)fVar90 >= (int)fVar110) * (int)fVar110;
            auVar63._12_4_ =
                 (uint)((int)fVar91 < (int)fVar111) * (int)fVar91 |
                 (uint)((int)fVar91 >= (int)fVar111) * (int)fVar111;
            auVar96._0_4_ =
                 (uint)((int)fVar99 < (int)fVar103) * (int)fVar103 |
                 (uint)((int)fVar99 >= (int)fVar103) * (int)fVar99;
            auVar96._4_4_ =
                 (uint)((int)fVar84 < (int)fVar104) * (int)fVar104 |
                 (uint)((int)fVar84 >= (int)fVar104) * (int)fVar84;
            auVar96._8_4_ =
                 (uint)((int)fVar85 < (int)fVar105) * (int)fVar105 |
                 (uint)((int)fVar85 >= (int)fVar105) * (int)fVar85;
            auVar96._12_4_ =
                 (uint)((int)fVar86 < (int)fVar106) * (int)fVar106 |
                 (uint)((int)fVar86 >= (int)fVar106) * (int)fVar86;
            auVar52._0_4_ =
                 (uint)((int)fVar100 < (int)fVar56) * (int)fVar56 |
                 (uint)((int)fVar100 >= (int)fVar56) * (int)fVar100;
            auVar52._4_4_ =
                 (uint)((int)fVar44 < (int)fVar66) * (int)fVar66 |
                 (uint)((int)fVar44 >= (int)fVar66) * (int)fVar44;
            auVar52._8_4_ =
                 (uint)((int)fVar45 < (int)fVar68) * (int)fVar68 |
                 (uint)((int)fVar45 >= (int)fVar68) * (int)fVar45;
            auVar52._12_4_ =
                 (uint)((int)fVar46 < (int)fVar70) * (int)fVar70 |
                 (uint)((int)fVar46 >= (int)fVar70) * (int)fVar46;
            auVar81 = minps(auVar96,auVar52);
            auVar73 = maxps(auVar94,auVar63);
            auVar73 = maxps(auVar73,auVar34);
            auVar35._4_4_ = iVar48;
            auVar35._0_4_ = iVar47;
            auVar35._8_4_ = iVar49;
            auVar35._12_4_ = iVar50;
            auVar34._4_4_ =
                 (uint)((int)fVar101 < (int)fVar109) * (int)fVar109 |
                 (uint)((int)fVar101 >= (int)fVar109) * (int)fVar101;
            auVar34._0_4_ =
                 (uint)((int)fVar98 < (int)fVar108) * (int)fVar108 |
                 (uint)((int)fVar98 >= (int)fVar108) * (int)fVar98;
            auVar34._8_4_ =
                 (uint)((int)fVar90 < (int)fVar110) * (int)fVar110 |
                 (uint)((int)fVar90 >= (int)fVar110) * (int)fVar90;
            auVar34._12_4_ =
                 (uint)((int)fVar91 < (int)fVar111) * (int)fVar111 |
                 (uint)((int)fVar91 >= (int)fVar111) * (int)fVar91;
            auVar34 = minps(auVar35,auVar34);
            auVar34 = minps(auVar34,auVar81);
            tNear.field_0.v[0] = auVar73._0_4_ * 0.99999964;
            tNear.field_0.v[1] = auVar73._4_4_ * 0.99999964;
            tNear.field_0.v[2] = auVar73._8_4_ * 0.99999964;
            tNear.field_0.v[3] = auVar73._12_4_ * 0.99999964;
            auVar53._4_4_ = -(uint)(tNear.field_0.v[1] <= auVar34._4_4_ * 1.0000004);
            auVar53._0_4_ = -(uint)(tNear.field_0.v[0] <= auVar34._0_4_ * 1.0000004);
            auVar53._8_4_ = -(uint)(tNear.field_0.v[2] <= auVar34._8_4_ * 1.0000004);
            auVar53._12_4_ = -(uint)(tNear.field_0.v[3] <= auVar34._12_4_ * 1.0000004);
            uVar26 = movmskps((int)unaff_RBP,auVar53);
            unaff_RBP = CONCAT44(uVar27,uVar26);
          }
          else {
            pfVar3 = (float *)(uVar23 + 0x80 + uVar31);
            pfVar1 = (float *)(uVar23 + 0x20 + uVar31);
            pfVar4 = (float *)(uVar23 + 0x80 + uVar25);
            pfVar2 = (float *)(uVar23 + 0x20 + uVar25);
            auVar58._0_4_ = ((*pfVar3 * fVar11 + *pfVar1) - fVar5) * fVar113;
            auVar58._4_4_ = ((pfVar3[1] * fVar11 + pfVar1[1]) - fVar5) * fVar113;
            auVar58._8_4_ = ((pfVar3[2] * fVar11 + pfVar1[2]) - fVar5) * fVar113;
            auVar58._12_4_ = ((pfVar3[3] * fVar11 + pfVar1[3]) - fVar5) * fVar113;
            auVar72._0_4_ = ((*pfVar4 * fVar11 + *pfVar2) - fVar6) * fVar87;
            auVar72._4_4_ = ((pfVar4[1] * fVar11 + pfVar2[1]) - fVar6) * fVar87;
            auVar72._8_4_ = ((pfVar4[2] * fVar11 + pfVar2[2]) - fVar6) * fVar87;
            auVar72._12_4_ = ((pfVar4[3] * fVar11 + pfVar2[3]) - fVar6) * fVar87;
            pfVar2 = (float *)(uVar23 + 0x80 + uVar32);
            pfVar1 = (float *)(uVar23 + 0x20 + uVar32);
            auVar33._0_4_ = ((*pfVar2 * fVar11 + *pfVar1) - fVar7) * fVar112;
            auVar33._4_4_ = ((pfVar2[1] * fVar11 + pfVar1[1]) - fVar7) * fVar112;
            auVar33._8_4_ = ((pfVar2[2] * fVar11 + pfVar1[2]) - fVar7) * fVar112;
            auVar33._12_4_ = ((pfVar2[3] * fVar11 + pfVar1[3]) - fVar7) * fVar112;
            auVar73 = maxps(auVar72,auVar33);
            auVar34 = maxps(auVar94,auVar58);
            pfVar2 = (float *)(uVar23 + 0x80 + (uVar31 ^ 0x10));
            pfVar1 = (float *)(uVar23 + 0x20 + (uVar31 ^ 0x10));
            tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar34,auVar73);
            auVar79._0_4_ = ((*pfVar2 * fVar11 + *pfVar1) - fVar5) * fVar97;
            auVar79._4_4_ = ((pfVar2[1] * fVar11 + pfVar1[1]) - fVar5) * fVar97;
            auVar79._8_4_ = ((pfVar2[2] * fVar11 + pfVar1[2]) - fVar5) * fVar97;
            auVar79._12_4_ = ((pfVar2[3] * fVar11 + pfVar1[3]) - fVar5) * fVar97;
            pfVar3 = (float *)(uVar23 + 0x80 + (uVar25 ^ 0x10));
            pfVar1 = (float *)(uVar23 + 0x20 + (uVar25 ^ 0x10));
            pfVar4 = (float *)(uVar23 + 0x80 + (uVar32 ^ 0x10));
            pfVar2 = (float *)(uVar23 + 0x20 + (uVar32 ^ 0x10));
            auVar74._0_4_ = ((*pfVar3 * fVar11 + *pfVar1) - fVar6) * fVar102;
            auVar74._4_4_ = ((pfVar3[1] * fVar11 + pfVar1[1]) - fVar6) * fVar102;
            auVar74._8_4_ = ((pfVar3[2] * fVar11 + pfVar1[2]) - fVar6) * fVar102;
            auVar74._12_4_ = ((pfVar3[3] * fVar11 + pfVar1[3]) - fVar6) * fVar102;
            auVar59._0_4_ = ((*pfVar4 * fVar11 + *pfVar2) - fVar7) * fVar107;
            auVar59._4_4_ = ((pfVar4[1] * fVar11 + pfVar2[1]) - fVar7) * fVar107;
            auVar59._8_4_ = ((pfVar4[2] * fVar11 + pfVar2[2]) - fVar7) * fVar107;
            auVar59._12_4_ = ((pfVar4[3] * fVar11 + pfVar2[3]) - fVar7) * fVar107;
            auVar73 = minps(auVar74,auVar59);
            auVar60._4_4_ = iVar48;
            auVar60._0_4_ = iVar47;
            auVar60._8_4_ = iVar49;
            auVar60._12_4_ = iVar50;
            auVar34 = minps(auVar60,auVar79);
            auVar34 = minps(auVar34,auVar73);
            if (uVar24 == 6) {
              bVar17 = (fVar11 < *(float *)(uVar23 + 0xf0) && *(float *)(uVar23 + 0xe0) <= fVar11)
                       && tNear.field_0._0_4_ <= auVar34._0_4_;
              bVar18 = (fVar11 < *(float *)(uVar23 + 0xf4) && *(float *)(uVar23 + 0xe4) <= fVar11)
                       && tNear.field_0._4_4_ <= auVar34._4_4_;
              bVar19 = (fVar11 < *(float *)(uVar23 + 0xf8) && *(float *)(uVar23 + 0xe8) <= fVar11)
                       && tNear.field_0._8_4_ <= auVar34._8_4_;
              bVar20 = (fVar11 < *(float *)(uVar23 + 0xfc) && *(float *)(uVar23 + 0xec) <= fVar11)
                       && tNear.field_0._12_4_ <= auVar34._12_4_;
            }
            else {
              bVar17 = tNear.field_0._0_4_ <= auVar34._0_4_;
              bVar18 = tNear.field_0._4_4_ <= auVar34._4_4_;
              bVar19 = tNear.field_0._8_4_ <= auVar34._8_4_;
              bVar20 = tNear.field_0._12_4_ <= auVar34._12_4_;
            }
            auVar51._0_4_ = (uint)bVar17 * -0x80000000;
            auVar51._4_4_ = (uint)bVar18 * -0x80000000;
            auVar51._8_4_ = (uint)bVar19 * -0x80000000;
            auVar51._12_4_ = (uint)bVar20 * -0x80000000;
            uVar26 = movmskps((int)unaff_RBP,auVar51);
            unaff_RBP = CONCAT44(uVar27,uVar26);
          }
        }
        if ((sVar29 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar22 = 4;
          }
          else {
            uVar23 = sVar29 & 0xfffffffffffffff0;
            lVar16 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
              }
            }
            iVar22 = 0;
            sVar29 = *(size_t *)(uVar23 + lVar16 * 8);
            uVar30 = unaff_RBP - 1 & unaff_RBP;
            if (uVar30 != 0) {
              uVar24 = tNear.field_0.i[lVar16];
              lVar16 = 0;
              if (uVar30 != 0) {
                for (; (uVar30 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                }
              }
              sVar14 = *(size_t *)(uVar23 + lVar16 * 8);
              uVar12 = tNear.field_0.i[lVar16];
              uVar30 = uVar30 - 1 & uVar30;
              if (uVar30 == 0) {
                if (uVar24 < uVar12) {
                  (pSVar28->ptr).ptr = sVar14;
                  pSVar28->dist = uVar12;
                  pSVar28 = pSVar28 + 1;
                }
                else {
                  (pSVar28->ptr).ptr = sVar29;
                  pSVar28->dist = uVar24;
                  pSVar28 = pSVar28 + 1;
                  sVar29 = sVar14;
                }
              }
              else {
                auVar54._8_4_ = uVar24;
                auVar54._0_8_ = sVar29;
                auVar54._12_4_ = 0;
                auVar77._8_4_ = uVar12;
                auVar77._0_8_ = sVar14;
                auVar77._12_4_ = 0;
                lVar16 = 0;
                if (uVar30 != 0) {
                  for (; (uVar30 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                  }
                }
                uVar15 = *(undefined8 *)(uVar23 + lVar16 * 8);
                iVar13 = tNear.field_0.i[lVar16];
                auVar64._8_4_ = iVar13;
                auVar64._0_8_ = uVar15;
                auVar64._12_4_ = 0;
                auVar36._8_4_ = -(uint)((int)uVar24 < (int)uVar12);
                uVar30 = uVar30 - 1 & uVar30;
                if (uVar30 == 0) {
                  auVar36._4_4_ = auVar36._8_4_;
                  auVar36._0_4_ = auVar36._8_4_;
                  auVar36._12_4_ = auVar36._8_4_;
                  auVar80._8_4_ = uVar12;
                  auVar80._0_8_ = sVar14;
                  auVar80._12_4_ = 0;
                  auVar81 = blendvps(auVar80,auVar54,auVar36);
                  auVar34 = blendvps(auVar54,auVar77,auVar36);
                  auVar37._8_4_ = -(uint)(auVar81._8_4_ < iVar13);
                  auVar37._4_4_ = auVar37._8_4_;
                  auVar37._0_4_ = auVar37._8_4_;
                  auVar37._12_4_ = auVar37._8_4_;
                  auVar78._8_4_ = iVar13;
                  auVar78._0_8_ = uVar15;
                  auVar78._12_4_ = 0;
                  auVar73 = blendvps(auVar78,auVar81,auVar37);
                  auVar81 = blendvps(auVar81,auVar64,auVar37);
                  auVar38._8_4_ = -(uint)(auVar34._8_4_ < auVar81._8_4_);
                  auVar38._4_4_ = auVar38._8_4_;
                  auVar38._0_4_ = auVar38._8_4_;
                  auVar38._12_4_ = auVar38._8_4_;
                  SVar65 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar81,auVar34,auVar38);
                  SVar55 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar34,auVar81,auVar38);
                  *pSVar28 = SVar55;
                  pSVar28[1] = SVar65;
                  sVar29 = auVar73._0_8_;
                  pSVar28 = pSVar28 + 2;
                }
                else {
                  lVar16 = 0;
                  if (uVar30 != 0) {
                    for (; (uVar30 >> lVar16 & 1) == 0; lVar16 = lVar16 + 1) {
                    }
                  }
                  auVar39._4_4_ = auVar36._8_4_;
                  auVar39._0_4_ = auVar36._8_4_;
                  auVar39._8_4_ = auVar36._8_4_;
                  auVar39._12_4_ = auVar36._8_4_;
                  auVar82 = blendvps(auVar77,auVar54,auVar39);
                  auVar34 = blendvps(auVar54,auVar77,auVar39);
                  auVar88._8_4_ = tNear.field_0.i[lVar16];
                  auVar88._0_8_ = *(undefined8 *)(uVar23 + lVar16 * 8);
                  auVar88._12_4_ = 0;
                  auVar40._8_4_ = -(uint)(iVar13 < tNear.field_0.i[lVar16]);
                  auVar40._4_4_ = auVar40._8_4_;
                  auVar40._0_4_ = auVar40._8_4_;
                  auVar40._12_4_ = auVar40._8_4_;
                  auVar81 = blendvps(auVar88,auVar64,auVar40);
                  auVar73 = blendvps(auVar64,auVar88,auVar40);
                  auVar41._8_4_ = -(uint)(auVar34._8_4_ < auVar73._8_4_);
                  auVar41._4_4_ = auVar41._8_4_;
                  auVar41._0_4_ = auVar41._8_4_;
                  auVar41._12_4_ = auVar41._8_4_;
                  auVar89 = blendvps(auVar73,auVar34,auVar41);
                  SVar55 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar34,auVar73,auVar41);
                  auVar42._8_4_ = -(uint)(auVar82._8_4_ < auVar81._8_4_);
                  auVar42._4_4_ = auVar42._8_4_;
                  auVar42._0_4_ = auVar42._8_4_;
                  auVar42._12_4_ = auVar42._8_4_;
                  auVar34 = blendvps(auVar81,auVar82,auVar42);
                  auVar73 = blendvps(auVar82,auVar81,auVar42);
                  auVar43._8_4_ = -(uint)(auVar73._8_4_ < auVar89._8_4_);
                  auVar43._4_4_ = auVar43._8_4_;
                  auVar43._0_4_ = auVar43._8_4_;
                  auVar43._12_4_ = auVar43._8_4_;
                  SVar65 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar89,auVar73,auVar43);
                  SVar83 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar73,auVar89,auVar43);
                  *pSVar28 = SVar55;
                  pSVar28[1] = SVar83;
                  pSVar28[2] = SVar65;
                  sVar29 = auVar34._0_8_;
                  pSVar28 = pSVar28 + 3;
                }
              }
            }
          }
        }
        else {
          iVar22 = 6;
        }
      } while (iVar22 == 0);
      if (iVar22 == 6) {
        (**(code **)((long)This->leafIntersector +
                    (ulong)*(byte *)(sVar29 & 0xfffffffffffffff0) * 0x40 + 0x10))(pre,ray,k,context)
        ;
        iVar47 = *(int *)(ray + k * 4 + 0x80);
        iVar48 = iVar47;
        iVar49 = iVar47;
        iVar50 = iVar47;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }